

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkDistance::IntLoadConstraint_C
          (ChLinkDistance *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar9 [16];
  
  iVar4 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    dVar1 = this->curr_dist - this->distance;
    if (do_clamp) {
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = recovery_clamp;
      auVar2._8_8_ = 0x8000000000000000;
      auVar2._0_8_ = 0x8000000000000000;
      auVar6 = vxorpd_avx512vl(auVar3,auVar2);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1 * c;
      auVar6 = vmaxsd_avx(auVar7,auVar6);
      auVar6 = vminsd_avx(auVar6,auVar3);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                          (ulong)off_L);
      *pSVar5 = auVar6._0_8_ + *pSVar5;
    }
    else {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                          (ulong)off_L);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = c;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar1;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *pSVar5;
      auVar6 = vfmadd213sd_fma(auVar9,auVar8,auVar6);
      *pSVar5 = auVar6._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkDistance::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                         ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                         const double c,            ///< a scaling factor
                                         bool do_clamp,             ///< apply clamping to c*C?
                                         double recovery_clamp      ///< value for min/max clamping of c*C
                                         ) {
    if (!IsActive())
        return;

    if (do_clamp)
        Qc(off_L) += ChMin(ChMax(c * (curr_dist - distance), -recovery_clamp), recovery_clamp);
    else
        Qc(off_L) += c * (curr_dist - distance);
}